

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FormatString.hpp
# Opt level: O2

string * __thiscall
Diligent::
FormatString<char[33],char_const*,char[22],std::__cxx11::string,char[6],char_const*,char[52],char_const*,char[2]>
          (string *__return_storage_ptr__,Diligent *this,char (*Args) [33],char **Args_1,
          char (*Args_2) [22],
          basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *Args_3,
          char (*Args_4) [6],char **Args_5,char (*Args_6) [52],char **Args_7,char (*Args_8) [2])

{
  stringstream ss;
  stringstream local_1b8 [392];
  
  std::__cxx11::stringstream::stringstream(local_1b8);
  FormatStrSS<std::__cxx11::stringstream,char[33],char_const*,char[22],std::__cxx11::string,char[6],char_const*,char[52],char_const*,char[2]>
            ((basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)local_1b8,
             (char (*) [33])this,(char **)Args,(char (*) [22])Args_1,
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)Args_2,
             (char (*) [6])Args_3,(char **)Args_4,(char (*) [52])Args_5,(char **)Args_6,
             (char (*) [2])Args_7);
  std::__cxx11::stringbuf::str();
  std::__cxx11::stringstream::~stringstream(local_1b8);
  return __return_storage_ptr__;
}

Assistant:

std::string FormatString(const RestArgsType&... Args)
{
    std::stringstream ss;
    FormatStrSS(ss, Args...);
    return ss.str();
}